

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O1

_Bool borg_has_mutiple(borg_item_conflict *in_item)

{
  _Bool _Var1;
  byte bVar2;
  ulong uVar3;
  borg_item_conflict *item;
  borg_item_conflict *pbVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  _Var1 = true;
  if (in_item->iqty < 2) {
    if (((in_item->ident != false) || (bVar2 = in_item->tval - 2, 0xf < bVar2)) ||
       ((0xdfffU >> (bVar2 & 0x1f) & 1) == 0)) {
      uVar3 = (ulong)z_info->pack_size;
      pbVar4 = borg_items;
      for (uVar5 = uVar3; uVar5 != 0; uVar5 = uVar5 - 1) {
        if (pbVar4 == in_item) {
          iVar7 = 5;
        }
        else if (((pbVar4->tval != in_item->tval) || (pbVar4->sval != in_item->sval)) ||
                (iVar7 = 1, pbVar4->iqty == '\0')) {
          iVar7 = 0;
        }
        if ((iVar7 != 5) && (iVar7 != 0)) {
          return true;
        }
        pbVar4 = pbVar4 + 1;
      }
      lVar6 = 100;
      do {
        if (((borg_items[uVar3].desc[lVar6 + -4] == in_item->tval) &&
            (borg_items[uVar3].desc[lVar6 + -3] == in_item->sval)) &&
           (borg_items[uVar3].desc[lVar6] != '\0')) {
          return true;
        }
        lVar6 = lVar6 + 0x388;
      } while (lVar6 != 0x2ac4);
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool borg_has_mutiple(borg_item *in_item)
{
    int i;
    if (in_item->iqty > 1)
        return true;

    /* Some types of items we only want to count as a dupe in a stack */
    /* for example two unIDd swords may look the same (both rapiers) */
    /* but have different powers */
    if (!in_item->ident) {
        switch (in_item->tval) {
        case TV_BOOTS:
        case TV_GLOVES:
        case TV_HELM:
        case TV_CROWN:
        case TV_SHIELD:
        case TV_SOFT_ARMOR:
        case TV_HARD_ARMOR:
        case TV_SHOT:
        case TV_BOLT:
        case TV_ARROW:
        case TV_BOW:
        case TV_DIGGING:
        case TV_HAFTED:
        case TV_POLEARM:
        case TV_SWORD:
           return false;
        }
    }

    /* check the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];
        if (item == in_item)
            continue;
        if (item->tval == in_item->tval 
            && item->sval == in_item->sval
            && item->iqty != 0)
            return true;
    }

    /* check equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];
        if (item->tval == in_item->tval
            && item->sval == in_item->sval
            && item->iqty != 0)
            return true;
    }
    return false;
}